

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O1

void pelelm_dermassfrac(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                       Geometry *param_6,Real param_7,int *param_8,int param_9)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  double *local_b0;
  double *local_a8;
  
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar3 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar15 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
  lVar25 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
  lVar12 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
  iVar6 = (bx->smallend).vect[0];
  iVar7 = (bx->smallend).vect[1];
  local_a8 = (derfab->super_BaseFab<double>).dptr + ((long)iVar6 - (long)iVar3);
  lVar1 = (long)iVar7 * 8;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  pdVar18 = (datfab->super_BaseFab<double>).dptr + ((long)iVar6 - (long)iVar2);
  lVar16 = lVar1 + (long)iVar3 * -8;
  iVar8 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar20 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar13 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar3) + 1);
  lVar11 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar8) + 1);
  iVar2 = (bx->smallend).vect[2];
  iVar3 = (bx->bigend).vect[0];
  iVar9 = (bx->bigend).vect[1];
  iVar10 = (bx->bigend).vect[2];
  lVar21 = 0;
  local_b0 = pdVar18;
  do {
    iVar24 = iVar2;
    if (iVar2 <= iVar10) {
      do {
        if (iVar7 <= iVar9) {
          lVar22 = (long)iVar24;
          pdVar14 = (double *)
                    (((dcomp * lVar12 * 8 + (long)iVar5 * -8 + lVar22 * 8) * lVar25 +
                     lVar1 + (long)iVar4 * -8) * lVar15 + (long)local_a8);
          pdVar17 = (double *)
                    (((lVar11 * 8 + (long)iVar8 * -8 + lVar22 * 8) * lVar13 + lVar16) * lVar20 +
                    (long)local_b0);
          pdVar23 = (double *)(((lVar22 - iVar8) * lVar13 * 8 + lVar16) * lVar20 + (long)pdVar18);
          lVar22 = (long)iVar7;
          do {
            if (iVar6 <= iVar3) {
              lVar19 = 0;
              do {
                pdVar14[lVar19] = (1.0 / pdVar23[lVar19]) * pdVar17[lVar19];
                lVar19 = lVar19 + 1;
              } while ((iVar3 - iVar6) + 1 != (int)lVar19);
            }
            lVar22 = lVar22 + 1;
            pdVar14 = pdVar14 + lVar15;
            pdVar17 = pdVar17 + lVar20;
            pdVar23 = pdVar23 + lVar20;
          } while (iVar9 + 1 != (int)lVar22);
        }
        bVar26 = iVar24 != iVar10;
        iVar24 = iVar24 + 1;
      } while (bVar26);
    }
    lVar21 = lVar21 + 1;
    local_a8 = local_a8 + lVar25 * lVar15 * lVar12;
    local_b0 = local_b0 + lVar13 * lVar20 * lVar11;
  } while (lVar21 != 0x15);
  return;
}

Assistant:

void pelelm_dermassfrac (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+1);
    AMREX_ASSERT(ncomp == NUM_SPECIES);
    auto const in_dat = datfab.array();
    auto       der = derfab.array(dcomp);
    amrex::ParallelFor(bx, NUM_SPECIES,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        amrex::Real rhoinv = 1.0 / in_dat(i,j,k,0);
        der(i,j,k,n) = in_dat(i,j,k,n+1) * rhoinv;
    });
}